

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anonymizer.cpp
# Opt level: O2

void process_string_table(section *s,string *filename)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar4;
  allocator<char> local_51;
  string str;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Info: processing string table section");
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar4 = 1;
  while( true ) {
    iVar2 = (*s->_vptr_section[0x13])(s);
    if (CONCAT44(extraout_var,iVar2) <= uVar4) break;
    iVar2 = (*s->_vptr_section[0x18])(s);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,(char *)(CONCAT44(extraout_var_00,iVar2) + uVar4),&local_51);
    bVar1 = std::operator==(&str,"main");
    if (bVar1) {
      iVar2 = (*s->_vptr_section[0x17])(s);
      overwrite_data(filename,CONCAT44(extraout_var_01,iVar2) + uVar4,&str);
    }
    uVar4 = uVar4 + str._M_string_length + 1;
    std::__cxx11::string::~string((string *)&str);
  }
  return;
}

Assistant:

void process_string_table( const section* s, const std::string& filename )
{
    std::cout << "Info: processing string table section" << std::endl;
    size_t index = 1;
    while ( index < s->get_size() ) {
        auto str = std::string( s->get_data() + index );
        // For the example purpose, we rename main function name only
        if ( str == "main" )
            overwrite_data( filename, s->get_offset() + index, str );
        index += str.length() + 1;
    }
}